

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::ListColumnWriter::Prepare
          (ListColumnWriter *this,ColumnWriterState *state_p,ColumnWriterState *parent,
          Vector *vector,idx_t count)

{
  unsafe_vector<uint16_t> *this_00;
  unsafe_vector<uint16_t> *this_01;
  vector<bool,_true> *this_02;
  pointer puVar1;
  long lVar2;
  Vector *list;
  bool bVar3;
  idx_t iVar4;
  Vector *other;
  pointer pCVar5;
  type pCVar6;
  IOException *this_03;
  idx_t k;
  ulong uVar7;
  size_type __n;
  ulong *puVar8;
  reference rVar9;
  unsigned_short local_ec;
  allocator local_e9;
  idx_t local_e8;
  ColumnWriterState *local_e0;
  idx_t local_d8;
  ColumnWriterState *local_d0;
  data_ptr_t local_c8;
  Vector *local_c0;
  idx_t local_b8;
  vector<bool,_true> *local_b0;
  TemplatedValidityMask<unsigned_long> *local_a8;
  idx_t local_a0;
  Vector child_list;
  
  local_c8 = vector->data;
  FlatVector::VerifyFlatVector(vector);
  local_d8 = count;
  if (parent != (ColumnWriterState *)0x0) {
    local_d8 = ((long)(parent->definition_levels).
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(parent->definition_levels).
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start >> 1) -
               (long)state_p[1].definition_levels.
                     super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
  }
  local_a8 = &(vector->validity).super_TemplatedValidityMask<unsigned_long>;
  local_b0 = &parent->is_empty;
  this_00 = &state_p->definition_levels;
  this_01 = &state_p->repetition_levels;
  this_02 = &state_p->is_empty;
  iVar4 = 0;
  local_e8 = 0;
  local_e0 = state_p;
  local_d0 = parent;
  local_c0 = vector;
  local_b8 = count;
  do {
    list = local_c0;
    puVar1 = state_p[1].definition_levels.
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar4 == local_d8) {
      state_p[1].definition_levels.super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)((long)puVar1 + local_d8);
      other = ListVector::GetEntry(local_c0);
      Vector::Vector(&child_list,other);
      iVar4 = GetConsecutiveChildList(list,&child_list,0,local_b8);
      pCVar5 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
               operator->(&this->child_writer);
      pCVar6 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
               ::operator*((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                            *)&local_e0[1].definition_levels.
                               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
      (*pCVar5->_vptr_ColumnWriter[6])(pCVar5,pCVar6,local_e0,&child_list,iVar4);
      Vector::~Vector(&child_list);
      return;
    }
    local_a0 = iVar4;
    if (local_d0 == (ColumnWriterState *)0x0) {
      local_ec = (unsigned_short)((this->super_ColumnWriter).column_schema)->max_repeat;
LAB_00e2eeb1:
      iVar4 = local_e8;
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid(local_a8,local_e8);
      if (bVar3) {
        lVar2 = *(long *)(local_c8 + iVar4 * 0x10 + 8);
        if (lVar2 == 0) {
          child_list._0_2_ = *(undefined2 *)&((this->super_ColumnWriter).column_schema)->max_define;
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          emplace_back<unsigned_short>
                    (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                     (unsigned_short *)&child_list);
        }
        else {
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                     &ColumnWriter::PARQUET_DEFINE_VALID);
        }
        puVar8 = (ulong *)(local_c8 + iVar4 * 0x10 + 8);
        ::std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)this_02,lVar2 == 0);
        child_list._0_2_ = local_ec;
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                   (unsigned_short *)&child_list);
        for (uVar7 = 1; uVar7 < *puVar8; uVar7 = uVar7 + 1) {
          child_list._0_2_ = (short)(int)((this->super_ColumnWriter).column_schema)->max_repeat + 1;
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          emplace_back<unsigned_short>
                    (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                     (unsigned_short *)&child_list);
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                     &ColumnWriter::PARQUET_DEFINE_VALID);
          ::std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)this_02,false);
        }
      }
      else {
        if ((this->super_ColumnWriter).can_have_nulls == false) {
          this_03 = (IOException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&child_list,
                     "Parquet writer: map key column is not allowed to contain NULL values",
                     &local_e9);
          IOException::IOException(this_03,(string *)&child_list);
          __cxa_throw(this_03,&IOException::typeinfo,::std::runtime_error::~runtime_error);
        }
        child_list._0_2_ = (short)(int)((this->super_ColumnWriter).column_schema)->max_define + -1;
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                   (unsigned_short *)&child_list);
        child_list._0_2_ = local_ec;
LAB_00e2ef2e:
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                   (unsigned_short *)&child_list);
        ::std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)this_02,true);
      }
      local_e8 = local_e8 + 1;
      state_p = local_e0;
    }
    else {
      __n = (long)puVar1 + iVar4;
      if ((((local_d0->is_empty).super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
            super__Bit_iterator_base._M_p ==
            (local_d0->is_empty).super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
            super__Bit_iterator_base._M_p) &&
          ((local_d0->is_empty).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._M_offset == 0)) ||
         (rVar9 = vector<bool,_true>::get<true>(local_b0,__n), (*rVar9._M_p & rVar9._M_mask) == 0))
      {
        puVar1 = (local_d0->repetition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar1 == (local_d0->repetition_levels).
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          local_ec = (unsigned_short)((this->super_ColumnWriter).column_schema)->max_repeat;
        }
        else {
          local_ec = puVar1[__n];
        }
        puVar1 = (local_d0->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar1[__n] == 0xffff) goto LAB_00e2eeb1;
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                   puVar1 + __n);
        child_list._0_2_ = local_ec;
        goto LAB_00e2ef2e;
      }
      ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&this_00->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                 (local_d0->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start + __n);
      ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&this_01->super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                 (local_d0->repetition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start + __n);
      ::std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)this_02,true);
    }
    iVar4 = local_a0 + 1;
  } while( true );
}

Assistant:

void ListColumnWriter::Prepare(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) {
	auto &state = state_p.Cast<ListColumnWriterState>();

	auto list_data = FlatVector::GetData<list_entry_t>(vector);
	auto &validity = FlatVector::Validity(vector);

	// write definition levels and repeats
	idx_t start = 0;
	idx_t vcount = parent ? parent->definition_levels.size() - state.parent_index : count;
	idx_t vector_index = 0;
	for (idx_t i = start; i < vcount; i++) {
		idx_t parent_index = state.parent_index + i;
		if (parent && !parent->is_empty.empty() && parent->is_empty[parent_index]) {
			state.definition_levels.push_back(parent->definition_levels[parent_index]);
			state.repetition_levels.push_back(parent->repetition_levels[parent_index]);
			state.is_empty.push_back(true);
			continue;
		}
		auto first_repeat_level =
		    parent && !parent->repetition_levels.empty() ? parent->repetition_levels[parent_index] : MaxRepeat();
		if (parent && parent->definition_levels[parent_index] != PARQUET_DEFINE_VALID) {
			state.definition_levels.push_back(parent->definition_levels[parent_index]);
			state.repetition_levels.push_back(first_repeat_level);
			state.is_empty.push_back(true);
		} else if (validity.RowIsValid(vector_index)) {
			// push the repetition levels
			if (list_data[vector_index].length == 0) {
				state.definition_levels.push_back(MaxDefine());
				state.is_empty.push_back(true);
			} else {
				state.definition_levels.push_back(PARQUET_DEFINE_VALID);
				state.is_empty.push_back(false);
			}
			state.repetition_levels.push_back(first_repeat_level);
			for (idx_t k = 1; k < list_data[vector_index].length; k++) {
				state.repetition_levels.push_back(MaxRepeat() + 1);
				state.definition_levels.push_back(PARQUET_DEFINE_VALID);
				state.is_empty.push_back(false);
			}
		} else {
			if (!can_have_nulls) {
				throw IOException("Parquet writer: map key column is not allowed to contain NULL values");
			}
			state.definition_levels.push_back(MaxDefine() - 1);
			state.repetition_levels.push_back(first_repeat_level);
			state.is_empty.push_back(true);
		}
		vector_index++;
	}
	state.parent_index += vcount;

	auto &list_child = ListVector::GetEntry(vector);
	Vector child_list(list_child);
	auto child_length = GetConsecutiveChildList(vector, child_list, 0, count);
	child_writer->Prepare(*state.child_state, &state_p, child_list, child_length);
}